

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

int bit_encode_write(bit_encode_t *be,uchar *bits,int nbits)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  bVar1 = be->bbits;
  uVar4 = (uint)bVar1 + nbits;
  if ((int)uVar4 < 8) {
    be->buf = be->buf | (*bits >> (8U - (char)nbits & 0x1f)) << (8U - (char)uVar4 & 0x1f);
  }
  else {
    uVar3 = (uint)be->buf;
    uVar5 = uVar4;
    do {
      fputc((uint)(*bits >> (bVar1 & 0x1f)) | uVar3 & 0xff,(FILE *)be->fh);
      bVar1 = be->bbits;
      uVar3 = (uint)*bits << (8 - bVar1 & 0x1f);
      be->buf = (uchar)uVar3;
      uVar4 = uVar5 - 8;
      bits = bits + 1;
      bVar2 = 0xf < uVar5;
      uVar5 = uVar4;
    } while (bVar2);
  }
  be->bbits = (uchar)uVar4;
  return nbits;
}

Assistant:

int
bit_encode_write(bit_encode_t *be, unsigned char const *bits, int nbits)
{
    int tbits;

    tbits = nbits + be->bbits;
    if (tbits < 8)  {
        /* Append to buffer. */
        be->buf |= ((bits[0] >> (8 - nbits)) << (8 - tbits));
    }
    else {
        int i = 0;
        while (tbits >= 8) {
            /* Shift bits out of the buffer and splice with high-order bits */
            fputc(be->buf | ((bits[i]) >> be->bbits), be->fh);
            /* Put low-order bits back into buffer */
            be->buf = (bits[i] << (8 - be->bbits)) & 0xff;
            tbits -= 8;
            ++i;
        }
    }
    /* tbits contains remaining number of  bits. */
    be->bbits = tbits;

    return nbits;
}